

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_newlock(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  int in_stack_0000123c;
  long in_stack_00001240;
  long in_stack_00001248;
  OBJ_DATA *in_stack_00001250;
  CHAR_DATA *in_stack_00001258;
  char *in_stack_00001260;
  
  newlock = (bool)((newlock ^ 0xffU) & 1);
  if (newlock == false) {
    wiznet(in_stack_00001260,in_stack_00001258,in_stack_00001250,in_stack_00001248,in_stack_00001240
           ,in_stack_0000123c);
    send_to_char(unaff_retaddr,in_RDI);
  }
  else {
    wiznet(in_stack_00001260,in_stack_00001258,in_stack_00001250,in_stack_00001248,in_stack_00001240
           ,in_stack_0000123c);
    send_to_char(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void do_newlock(CHAR_DATA *ch, char *argument)
{
	newlock = !newlock;

	if (newlock)
	{
		wiznet("$N locks out new characters.", ch, nullptr, 0, 0, 0);
		send_to_char("New characters have been locked out.\n\r", ch);
	}
	else
	{
		wiznet("$N allows new characters back in.", ch, nullptr, 0, 0, 0);
		send_to_char("Newlock removed.\n\r", ch);
	}
}